

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_KnapsackSolver_targetvalue_0_Test::TestBody
          (CoinSelection_SelectCoins_Simple_KnapsackSolver_targetvalue_0_Test *this)

{
  bool bVar1;
  bool *searched_bnb;
  char *pcVar2;
  char *in_R9;
  Amount AVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  CoinSelectionOption option;
  bool use_bnb;
  Amount tx_fee;
  Amount fee;
  Amount select_value;
  Amount target_amount;
  bool **in_stack_fffffffffffffd68;
  CoinSelectionOption *in_stack_fffffffffffffd70;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd78;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  string local_220;
  AssertHelper local_200;
  Message local_1f8;
  byte local_1e9;
  AssertionResult local_1e8;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined4 local_1c4;
  int64_t local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  int64_t local_190;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  size_type local_160;
  AssertionResult local_158;
  AssertHelper local_148;
  Message local_140 [8];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_100;
  char local_d8 [32];
  CoinSelectionOption *in_stack_ffffffffffffff48;
  UtxoFilter *in_stack_ffffffffffffff50;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_ffffffffffffff58;
  Amount *in_stack_ffffffffffffff60;
  CoinSelection *in_stack_ffffffffffffff68;
  Amount *in_stack_ffffffffffffff80;
  Amount *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte bVar4;
  bool *local_58;
  undefined1 local_50;
  undefined1 local_48 [16];
  uint64_t local_28;
  undefined1 local_20;
  uint64_t local_18;
  undefined1 local_10;
  
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0);
  local_28 = AVar3.amount_;
  local_20 = AVar3.ignore_check_;
  local_18 = local_28;
  local_10 = local_20;
  cfd::core::Amount::Amount((Amount *)&stack0xffffffffffffffc8);
  cfd::core::Amount::Amount((Amount *)local_48);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0);
  searched_bnb = (bool *)AVar3.amount_;
  local_50 = AVar3.ignore_check_;
  bVar4 = 0;
  local_58 = searched_bnb;
  GetBitcoinOption();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x25b6e1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetBitcoinUtxoList();
      in_stack_fffffffffffffd80 =
           (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)&stack0xffffffffffffff97;
      in_stack_fffffffffffffd78 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_48;
      in_stack_fffffffffffffd70 = (CoinSelectionOption *)&stack0xffffffffffffffc8;
      in_stack_fffffffffffffd68 = &local_58;
      in_R9 = local_d8;
      cfd::CoinSelection::SelectCoins
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff88,(Amount *)CONCAT17(bVar4,in_stack_ffffffffffffff90),
                 searched_bnb);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd80);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd80);
    }
  }
  else {
    testing::Message::Message(local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x92,
               "Expected: ret = exp_selection.SelectCoins( target_amount, GetBitcoinUtxoList(), exp_filter, option, tx_fee, &select_value, &fee, &use_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_148,local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message((Message *)0x25b8b5);
  }
  local_160 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_100);
  local_164 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (char *)in_stack_fffffffffffffd80,(unsigned_long *)in_stack_fffffffffffffd78,
             (int *)in_stack_fffffffffffffd70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x25b9a4);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x25ba01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25ba59);
  local_190 = cfd::core::Amount::GetSatoshiValue((Amount *)&stack0xffffffffffffffc8);
  local_194 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (char *)in_stack_fffffffffffffd80,(long *)in_stack_fffffffffffffd78,
             (int *)in_stack_fffffffffffffd70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x25bb1b);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message((Message *)0x25bb78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25bbd0);
  local_1c0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_48);
  local_1c4 = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (char *)in_stack_fffffffffffffd80,(long *)in_stack_fffffffffffffd78,
             (int *)in_stack_fffffffffffffd70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x25bc92);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    testing::Message::~Message((Message *)0x25bcef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25bd44);
  local_1e9 = ~bVar4 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffd70,(bool *)in_stack_fffffffffffffd68,
             (type *)0x25bd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_220,(internal *)&local_1e8,(AssertionResult *)"use_bnb","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    testing::Message::~Message((Message *)0x25be5e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x25bed3);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd80);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x25beed);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_KnapsackSolver_targetvalue_0)
{
  Amount target_amount = Amount::CreateBySatoshiAmount(0);
  Amount select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(0);
  bool use_bnb = false;
  CoinSelectionOption option = GetBitcoinOption();
  option.SetEffectiveFeeBaserate(0.0);
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      target_amount, GetBitcoinUtxoList(), exp_filter, option,
      tx_fee, &select_value, &fee, &use_bnb));

  EXPECT_EQ(ret.size(), 0);
  EXPECT_EQ(select_value.GetSatoshiValue(), 0);
  EXPECT_EQ(fee.GetSatoshiValue(), 0);
  EXPECT_FALSE(use_bnb);
}